

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

Define * find_define_by_token(Context_conflict1 *ctx)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  IncludeState *ctx_00;
  Define *pDVar4;
  undefined8 uStack_30;
  char acStack_28 [8];
  char *local_20;
  char *sym;
  IncludeState *state;
  Context_conflict1 *ctx_local;
  
  sym = (char *)ctx->include_stack;
  state = (IncludeState *)ctx;
  if (((IncludeState *)sym)->tokenval == TOKEN_IDENTIFIER) {
    lVar3 = -((ulong)(((IncludeState *)sym)->tokenlen + 1) + 0xf & 0xfffffffffffffff0);
    pcVar2 = ((IncludeState *)sym)->token;
    uVar1 = ((IncludeState *)sym)->tokenlen;
    local_20 = acStack_28 + lVar3;
    *(undefined8 *)((long)&uStack_30 + lVar3) = 0x140203;
    memcpy(acStack_28 + lVar3,pcVar2,(ulong)uVar1);
    ctx_00 = state;
    pcVar2 = local_20;
    local_20[*(uint *)(sym + 0x20)] = '\0';
    *(undefined8 *)((long)&uStack_30 + lVar3) = 0x14021f;
    pDVar4 = find_define((Context_conflict1 *)ctx_00,pcVar2);
    return pDVar4;
  }
  uStack_30 = 0x1401c9;
  __assert_fail("state->tokenval == TOKEN_IDENTIFIER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                ,0x1e7,"const Define *find_define_by_token(Context *)");
}

Assistant:

static const Define *find_define_by_token(Context *ctx)
{
    IncludeState *state = ctx->include_stack;
    assert(state->tokenval == TOKEN_IDENTIFIER);
    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';
    return find_define(ctx, sym);
}